

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# akarin_camera_system.cpp
# Opt level: O1

mat4 * AkarinCameraSystem::get_projection(void)

{
  float fVar1;
  float fVar2;
  mat4 *in_RDI;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = akarin_camera.m_zoom;
  fVar4 = AkarinGLFW::get_window_size_ratio();
  fVar2 = akarin_camera.clip_far;
  fVar1 = akarin_camera.clip_near;
  fVar6 = fVar4 + -1.1920929e-07;
  uVar3 = -(uint)(-fVar6 <= fVar6);
  if (0.0 < (float)(~uVar3 & (uint)-fVar6 | (uint)fVar6 & uVar3)) {
    fVar5 = tanf(fVar5 * 0.017453292 * 0.5);
    in_RDI->value[0].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    in_RDI->value[0].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    in_RDI->value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    in_RDI->value[0].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    in_RDI->value[1].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    in_RDI->value[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    in_RDI->value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    in_RDI->value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    in_RDI->value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    in_RDI->value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    in_RDI->value[2].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    in_RDI->value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    in_RDI->value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
    in_RDI->value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    in_RDI->value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    in_RDI->value[3].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
    in_RDI->value[0].field_0.x = 1.0 / (fVar4 * fVar5);
    in_RDI->value[1].field_1.y = 1.0 / fVar5;
    in_RDI->value[2].field_2.z = -(fVar1 + fVar2) / (fVar2 - fVar1);
    in_RDI->value[2].field_3.w = -1.0;
    in_RDI->value[3].field_2.z = (fVar2 * -2.0 * fVar1) / (fVar2 - fVar1);
    return in_RDI;
  }
  __assert_fail("abs(aspect - std::numeric_limits<T>::epsilon()) > static_cast<T>(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/glm/glm/gtc/../ext/matrix_clip_space.inl"
                ,0xf1,"mat<4, 4, T, defaultp> glm::perspectiveRH_NO(T, T, T, T) [T = float]");
}

Assistant:

glm::mat4 AkarinCameraSystem::get_projection() noexcept
{
    return glm::perspective(
        glm::radians(akarin_camera.m_zoom),
        AkarinGLFW::get_window_size_ratio(),
        akarin_camera.clip_near,
        akarin_camera.clip_far);
}